

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

int flatcc_builder_start_buffer
              (flatcc_builder_t *B,char *identifier,uint16_t block_align,
              flatcc_builder_buffer_flags_t flags)

{
  flatbuffers_uoffset_t fVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  
  iVar2 = enter_frame(B,B->min_align);
  iVar3 = -1;
  if (iVar2 == 0) {
    if ((B->nest_id != 0) || (B->min_align == 0)) {
      B->min_align = 1;
    }
    (B->frame->container).buffer.block_align = B->block_align;
    B->block_align = block_align;
    (B->frame->container).buffer.flags = B->buffer_flags;
    B->buffer_flags = flags;
    (B->frame->container).table.pl_end = B->buffer_mark;
    (B->frame->container).buffer.nest_id = B->nest_id;
    B->buffer_mark = B->emit_start;
    fVar1 = B->nest_count;
    B->nest_count = fVar1 + 1;
    B->nest_id = fVar1;
    (B->frame->container).table.vs_end = B->identifier;
    puVar4 = "";
    if (identifier != (char *)0x0) {
      puVar4 = (uint8_t *)identifier;
    }
    B->identifier = *(flatcc_builder_identifier_t *)puVar4;
    B->frame->type = 1;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int flatcc_builder_start_buffer(flatcc_builder_t *B,
        const char identifier[identifier_size], uint16_t block_align, flatcc_builder_buffer_flags_t flags)
{
    /*
     * This saves the parent `min_align` in the align field since we
     * shouldn't use that for the current buffer. `exit_frame`
     * automatically aggregates align up, so it is updated when the
     * buffer frame exits.
     */
    if (enter_frame(B, B->min_align)) {
        return -1;
    }
    /* B->align now has parent min_align, and child frames will save it. */
    /* Since we allow objects to be created before the buffer at top level,
       we need to respect min_align in that case. */
    if (!is_top_buffer(B) || B->min_align == 0) {
        B->min_align = 1;
    }
    /* Save the parent block align, and set proper defaults for this buffer. */
    frame(container.buffer.block_align) = B->block_align;
    B->block_align = block_align;
    frame(container.buffer.flags = B->buffer_flags);
    B->buffer_flags = (uint16_t)flags;
    frame(container.buffer.mark) = B->buffer_mark;
    frame(container.buffer.nest_id) = B->nest_id;
    /*
     * End of buffer when nested. Not defined for top-level because we
     * here (on only here) permit strings etc. to be created before buffer start and
     * because top-level buffer vtables can be clustered.
     */
    B->buffer_mark = B->emit_start;
    /* Must be 0 before and after entering top-level buffer, and unique otherwise. */
    B->nest_id = B->nest_count++;
    frame(container.buffer.identifier) = B->identifier;
    set_identifier(identifier);
    frame(type) = flatcc_builder_buffer;
    return 0;
}